

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

bool __thiscall
duckdb_re2::Prog::SearchDFA
          (Prog *this,StringPiece *text,StringPiece *const_context,Anchor anchor,MatchKind kind,
          StringPiece *match0,bool *failed,SparseSet *matches)

{
  undefined1 uVar1;
  const_pointer pcVar2;
  DFA *this_00;
  DFASearchFailureCallback *pDVar3;
  size_type sVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  DFASearchFailure local_55;
  undefined4 local_54;
  char *ep;
  StringPiece context;
  
  *failed = false;
  context.data_ = const_context->data_;
  context.size_ = const_context->size_;
  if (context.data_ == (const_pointer)0x0) {
    context.data_ = text->data_;
    context.size_ = text->size_;
  }
  uVar1 = this->anchor_start_;
  bVar7 = this->anchor_end_;
  bVar6 = uVar1;
  bVar5 = bVar7;
  if (this->reversed_ != false) {
    bVar6 = bVar7;
    bVar5 = uVar1;
  }
  if ((bVar6 == 1) && (context.data_ != text->data_)) {
    return false;
  }
  if ((bVar5 != 0) && (context.data_ + context.size_ != text->data_ + text->size_)) {
    return false;
  }
  bVar5 = true;
  if (anchor != kAnchored) {
    bVar5 = kind == kFullMatch | uVar1;
  }
  if (kind == kFullMatch) {
LAB_00410fcb:
    local_54 = 1;
    kind = kLongestMatch;
  }
  else {
    if (kind == kManyMatch) {
      bVar7 = matches == (SparseSet *)0x0;
      local_54 = 0;
      kind = kManyMatch;
      goto LAB_00410ff2;
    }
    if (bVar7 != false) goto LAB_00410fcb;
    local_54 = 0;
  }
  if (match0 == (StringPiece *)0x0) {
    bVar7 = (bool)((byte)local_54 ^ 1);
    if ((byte)local_54 == 0) {
      kind = kLongestMatch;
    }
  }
  else {
    bVar7 = false;
  }
LAB_00410ff2:
  this_00 = GetDFA(this,kind);
  bVar7 = DFA::Search(this_00,text,&context,(bool)bVar5,bVar7,(bool)(this->reversed_ ^ 1),failed,&ep
                      ,matches);
  if (*failed == true) {
    pDVar3 = hooks::GetDFASearchFailureHook();
    (*pDVar3)(&local_55);
  }
  else if (bVar7) {
    if ((char)local_54 != '\0') {
      if (this->reversed_ == false) {
        sVar4 = text->size_;
      }
      else {
        sVar4 = 0;
      }
      if (ep != text->data_ + sVar4) {
        return false;
      }
    }
    if (match0 == (StringPiece *)0x0) {
      return true;
    }
    if (this->reversed_ != true) {
      pcVar2 = text->data_;
      match0->data_ = pcVar2;
      match0->size_ = (long)ep - (long)pcVar2;
      return true;
    }
    pcVar2 = text->data_;
    sVar4 = text->size_;
    match0->data_ = ep;
    match0->size_ = (size_type)(pcVar2 + (sVar4 - (long)ep));
    return true;
  }
  return false;
}

Assistant:

bool Prog::SearchDFA(const StringPiece& text, const StringPiece& const_context,
                     Anchor anchor, MatchKind kind, StringPiece* match0,
                     bool* failed, SparseSet* matches) {
  *failed = false;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;
  bool caret = anchor_start();
  bool dollar = anchor_end();
  if (reversed_) {
    using std::swap;
    swap(caret, dollar);
  }
  if (caret && BeginPtr(context) != BeginPtr(text))
    return false;
  if (dollar && EndPtr(context) != EndPtr(text))
    return false;

  // Handle full match by running an anchored longest match
  // and then checking if it covers all of text.
  bool anchored = anchor == kAnchored || anchor_start() || kind == kFullMatch;
  bool endmatch = false;
  if (kind == kManyMatch) {
    // This is split out in order to avoid clobbering kind.
  } else if (kind == kFullMatch || anchor_end()) {
    endmatch = true;
    kind = kLongestMatch;
  }

  // If the caller doesn't care where the match is (just whether one exists),
  // then we can stop at the very first match we find, the so-called
  // "earliest match".
  bool want_earliest_match = false;
  if (kind == kManyMatch) {
    // This is split out in order to avoid clobbering kind.
    if (matches == NULL) {
      want_earliest_match = true;
    }
  } else if (match0 == NULL && !endmatch) {
    want_earliest_match = true;
    kind = kLongestMatch;
  }

  DFA* dfa = GetDFA(kind);
  const char* ep;
  bool matched = dfa->Search(text, context, anchored,
                             want_earliest_match, !reversed_,
                             failed, &ep, matches);
  if (*failed) {
    hooks::GetDFASearchFailureHook()({
        // Nothing yet...
    });
    return false;
  }
  if (!matched)
    return false;
  if (endmatch && ep != (reversed_ ? text.data() : text.data() + text.size()))
    return false;

  // If caller cares, record the boundary of the match.
  // We only know where it ends, so use the boundary of text
  // as the beginning.
  if (match0) {
    if (reversed_)
      *match0 =
          StringPiece(ep, static_cast<size_t>(text.data() + text.size() - ep));
    else
      *match0 =
          StringPiece(text.data(), static_cast<size_t>(ep - text.data()));
  }
  return true;
}